

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  int *piVar6;
  void *__addr;
  size_type *psVar7;
  __sighandler_t p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _union_1457 *p_Var12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar13;
  undefined8 uVar14;
  size_t __len;
  vector<char_*,_std::allocator<char_*>_> argv;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  ExecDeathTestArgs args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_200;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  int local_1b8 [2];
  value_type local_1b0;
  value_type local_190;
  _union_1457 local_170;
  undefined1 local_168 [8];
  ulong local_160;
  ulong uStack_158;
  _union_1457 local_d8;
  long local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [8];
  pointer local_40;
  int local_38;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1b8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar2 = pipe(&local_1e0);
  if (iVar2 == -1) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar7) {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
      local_2c8.field_2._8_8_ = plVar4[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
      local_308.field_2._M_allocated_capacity = *psVar7;
      local_308.field_2._8_8_ = plVar4[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar7;
    }
    local_308._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_268._M_dataplus._M_p._0_4_ = 0x557;
    StreamableToString<int>(&local_2a8,(int *)&local_268);
    std::operator+(&local_2e8,&local_308,&local_2a8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_170.sa_handler = (__sighandler_t)*plVar4;
    p_Var8 = (__sighandler_t)(plVar4 + 2);
    if (local_170.sa_handler == p_Var8) {
      local_160 = *(ulong *)p_Var8;
      uStack_158 = plVar4[3];
      local_170.sa_handler = (__sighandler_t)&local_160;
    }
    else {
      local_160 = *(ulong *)p_Var8;
    }
    local_168 = (undefined1  [8])plVar4[1];
    *plVar4 = (long)p_Var8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d8.sa_handler = (__sighandler_t)*plVar4;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.sa_handler == paVar11) {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_c8[0]._8_8_ = plVar4[3];
      local_d8.sa_handler = (__sighandler_t)local_c8;
    }
    else {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)paVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort((string *)&local_d8);
  }
  iVar2 = fcntl(local_1dc,2,0);
  if (iVar2 == -1) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar7) {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
      local_2c8.field_2._8_8_ = plVar4[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
      local_308.field_2._M_allocated_capacity = *psVar7;
      local_308.field_2._8_8_ = plVar4[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar7;
    }
    local_308._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_268._M_dataplus._M_p._0_4_ = 0x55a;
    StreamableToString<int>(&local_2a8,(int *)&local_268);
    std::operator+(&local_2e8,&local_308,&local_2a8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_170.sa_handler = (__sighandler_t)*plVar4;
    p_Var8 = (__sighandler_t)(plVar4 + 2);
    if (local_170.sa_handler == p_Var8) {
      local_160 = *(ulong *)p_Var8;
      uStack_158 = plVar4[3];
      local_170.sa_handler = (__sighandler_t)&local_160;
    }
    else {
      local_160 = *(ulong *)p_Var8;
    }
    local_168 = (undefined1  [8])plVar4[1];
    *plVar4 = (long)p_Var8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d8.sa_handler = (__sighandler_t)*plVar4;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.sa_handler == paVar11) {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_c8[0]._8_8_ = plVar4[3];
      local_d8.sa_handler = (__sighandler_t)local_c8;
    }
    else {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)paVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort((string *)&local_d8);
  }
  paVar11 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_308.field_2._M_allocated_capacity = *psVar7;
    local_308.field_2._8_8_ = plVar4[3];
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar7;
    local_308._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_308._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2e8.field_2._M_allocated_capacity = *psVar7;
    local_2e8.field_2._8_8_ = plVar4[3];
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar7;
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2e8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_170.sa_handler = (__sighandler_t)&local_160;
  p_Var8 = (__sighandler_t)(plVar4 + 2);
  if ((__sighandler_t)*plVar4 == p_Var8) {
    local_160 = *(ulong *)p_Var8;
    uStack_158 = plVar4[3];
  }
  else {
    local_160 = *(ulong *)p_Var8;
    local_170.sa_handler = (__sighandler_t)*plVar4;
  }
  local_168 = (undefined1  [8])plVar4[1];
  *plVar4 = (long)p_Var8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar9) {
    local_c8[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_c8[0]._8_8_ = plVar4[3];
    local_d8.sa_handler = (__sighandler_t)local_c8;
  }
  else {
    local_c8[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_d8.sa_handler = (__sighandler_t)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)paVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_190.field_2._M_allocated_capacity = *psVar7;
    local_190.field_2._8_8_ = plVar4[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar7;
    local_190._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_190._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  if (local_170.sa_handler != (__sighandler_t)&local_160) {
    operator_delete(local_170.sa_handler,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar11) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"--","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_268.field_2._M_allocated_capacity = *psVar7;
    local_268.field_2._8_8_ = plVar4[3];
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar7;
    local_268._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_268._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8.field_2._8_8_ = plVar4[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2a8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_288.field_2._M_allocated_capacity = *psVar7;
    local_288.field_2._8_8_ = plVar4[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar7;
    local_288._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_288._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2c8.field_2._M_allocated_capacity = *puVar10;
    local_2c8.field_2._8_8_ = plVar4[3];
    local_2c8._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *puVar10;
    local_2c8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2c8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StreamableToString<int>(&local_200,&this->line_);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar11) {
    uVar14 = local_2c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_200._M_string_length + local_2c8._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_) !=
        &local_200.field_2) {
      uVar14 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_200._M_string_length + local_2c8._M_string_length) goto LAB_001260fc;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_200,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
  }
  else {
LAB_001260fc:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2c8,
                        (ulong)CONCAT44(local_200._M_dataplus._M_p._4_4_,
                                        local_200._M_dataplus._M_p._0_4_));
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_308.field_2._M_allocated_capacity = *psVar7;
    local_308.field_2._8_8_ = puVar5[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar7;
    local_308._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_308._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  puVar10 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2e8.field_2._M_allocated_capacity = *puVar10;
    local_2e8.field_2._8_8_ = plVar4[3];
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *puVar10;
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2e8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StreamableToString<int>((string *)local_1d8,local_1b8);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    uVar14 = local_2e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1d8._8_8_ + local_2e8._M_string_length) {
    uVar14 = 0xf;
    if ((_union_1457 *)local_1d8._0_8_ != (_union_1457 *)(local_1d8 + 0x10)) {
      uVar14 = local_1c8._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1d8._8_8_ + local_2e8._M_string_length) goto LAB_0012621f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_1d8,0,(char *)0x0,(ulong)local_2e8._M_dataplus._M_p);
  }
  else {
LAB_0012621f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,local_1d8._0_8_);
  }
  local_170.sa_handler = (__sighandler_t)&local_160;
  p_Var8 = (__sighandler_t)(puVar5 + 2);
  if ((__sighandler_t)*puVar5 == p_Var8) {
    local_160 = *(ulong *)p_Var8;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *(ulong *)p_Var8;
    local_170.sa_handler = (__sighandler_t)*puVar5;
  }
  local_168 = (undefined1  [8])puVar5[1];
  *puVar5 = p_Var8;
  puVar5[1] = 0;
  *p_Var8 = (__sighandler_t)0x0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar9) {
    local_c8[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_c8[0]._8_8_ = plVar4[3];
    local_d8.sa_handler = (__sighandler_t)local_c8;
  }
  else {
    local_c8[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_d8.sa_handler = (__sighandler_t)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)paVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StreamableToString<int>(&local_228,&local_1dc);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    uVar14 = local_c8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_228._M_string_length + local_d0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar14 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_228._M_string_length + local_d0) goto LAB_00126365;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_00126365:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_228._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1b0.field_2._M_allocated_capacity = *psVar7;
    local_1b0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar7;
    local_1b0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1b0._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  if (local_170.sa_handler != (__sighandler_t)&local_160) {
    operator_delete(local_170.sa_handler,local_160 + 1);
  }
  if ((_union_1457 *)local_1d8._0_8_ != (_union_1457 *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_),
                    local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar11) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,&local_1b0);
  local_d8.sa_handler = (__sighandler_t)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_228.field_2._M_allocated_capacity = 0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            ((vector<char_*,_std::allocator<char_*>_> *)&local_228,
             ((long)(local_1d8._8_8_ - local_1d8._0_8_) >> 5) + 1);
  if (local_1d8._0_8_ != local_1d8._8_8_) {
    p_Var12 = (_union_1457 *)local_1d8._0_8_;
    do {
      local_d8 = *p_Var12;
      if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
                  ((vector<char*,std::allocator<char*>> *)&local_228,
                   (iterator)local_228._M_string_length,(char **)&local_d8.sa_handler);
      }
      else {
        *(_union_1457 *)local_228._M_string_length = local_d8;
        local_228._M_string_length = local_228._M_string_length + 8;
      }
      p_Var12 = p_Var12 + 4;
    } while (p_Var12 != (_union_1457 *)local_1d8._8_8_);
  }
  local_d8.sa_handler = (__sighandler_t)0x0;
  if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
              ((vector<char*,std::allocator<char*>> *)&local_228,
               (iterator)local_228._M_string_length,(char **)&local_d8.sa_handler);
  }
  else {
    *(char **)local_228._M_string_length = (char *)0x0;
    local_228._M_string_length = local_228._M_string_length + 8;
  }
  local_40 = local_228._M_dataplus._M_p;
  local_38 = local_1e0;
  memset(&local_170,0,0x98);
  sigemptyset((sigset_t *)local_168);
  local_170 = (_union_1457)0x1;
  while (iVar2 = sigaction(0x1b,(sigaction *)&local_170,(sigaction *)&local_d8), iVar2 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","")
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_268._M_dataplus._M_p == psVar7) {
        local_268.field_2._M_allocated_capacity = *psVar7;
        local_268.field_2._8_8_ = plVar4[3];
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar7;
      }
      local_268._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2a8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
        local_2a8.field_2._M_allocated_capacity = *psVar7;
        local_2a8.field_2._8_8_ = plVar4[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2a8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_1b8[1] = 0x515;
      StreamableToString<int>(&local_200,local_1b8 + 1);
      std::operator+(&local_288,&local_2a8,&local_200);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2c8._M_dataplus._M_p == psVar7) {
        local_2c8.field_2._M_allocated_capacity = *psVar7;
        local_2c8.field_2._8_8_ = plVar4[3];
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2c8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_308._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
        local_308.field_2._M_allocated_capacity = *psVar7;
        local_308.field_2._8_8_ = plVar4[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar7;
      }
      local_308._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_2e8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
        local_2e8.field_2._M_allocated_capacity = *psVar7;
        local_2e8.field_2._8_8_ = plVar4[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2e8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      DeathTestAbort(&local_2e8);
    }
  }
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_00126e68;
  }
  else {
    iVar2 = fork();
    if (iVar2 != 0) goto LAB_00126870;
    ExecDeathTestChildMain(&local_40);
LAB_00126e68:
    AssumeRole();
  }
  iVar2 = getpagesize();
  __len = (size_t)(iVar2 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_2a8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
      local_2a8.field_2._8_8_ = plVar4[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_288._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_288._M_dataplus._M_p == psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar4[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
    }
    local_288._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_200._M_dataplus._M_p._0_4_ = 0x521;
    StreamableToString<int>(&local_248,(int *)&local_200);
    std::operator+(&local_2c8,&local_288,&local_248);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
      local_308.field_2._M_allocated_capacity = *psVar7;
      local_308.field_2._8_8_ = plVar4[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar7;
    }
    local_308._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
      local_2e8.field_2._8_8_ = plVar4[3];
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort(&local_2e8);
  }
  lVar13 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar13 = __len - 0x40;
  }
  if (((uint)(iVar2 * 2) < 0x41) || (((ulong)(lVar13 + (long)__addr) & 0x3f) != 0)) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_2a8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
      local_2a8.field_2._8_8_ = plVar4[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_288._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_288._M_dataplus._M_p == psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar4[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
    }
    local_288._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_200._M_dataplus._M_p._0_4_ = 0x52f;
    StreamableToString<int>(&local_248,(int *)&local_200);
    std::operator+(&local_2c8,&local_288,&local_248);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
      local_308.field_2._M_allocated_capacity = *psVar7;
      local_308.field_2._8_8_ = plVar4[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar7;
    }
    local_308._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
      local_2e8.field_2._8_8_ = plVar4[3];
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort(&local_2e8);
  }
  iVar2 = clone(ExecDeathTestChildMain,(void *)(lVar13 + (long)__addr),0x11,&local_40);
  iVar3 = munmap(__addr,__len);
  if (iVar3 == -1) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_2a8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
      local_2a8.field_2._8_8_ = plVar4[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_288._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_288._M_dataplus._M_p == psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar4[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
    }
    local_288._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_200._M_dataplus._M_p._0_4_ = 0x533;
    StreamableToString<int>(&local_248,(int *)&local_200);
    std::operator+(&local_2c8,&local_288,&local_248);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
      local_308.field_2._M_allocated_capacity = *psVar7;
      local_308.field_2._8_8_ = plVar4[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar7;
    }
    local_308._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
      local_2e8.field_2._8_8_ = plVar4[3];
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort(&local_2e8);
  }
LAB_00126870:
  while (iVar3 = sigaction(0x1b,(sigaction *)&local_d8,(sigaction *)0x0), iVar3 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","")
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_268._M_dataplus._M_p == psVar7) {
        local_268.field_2._M_allocated_capacity = *psVar7;
        local_268.field_2._8_8_ = plVar4[3];
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar7;
      }
      local_268._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2a8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
        local_2a8.field_2._M_allocated_capacity = *psVar7;
        local_2a8.field_2._8_8_ = plVar4[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2a8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_1b8[1] = 0x53f;
      StreamableToString<int>(&local_200,local_1b8 + 1);
      std::operator+(&local_288,&local_2a8,&local_200);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2c8._M_dataplus._M_p == psVar7) {
        local_2c8.field_2._M_allocated_capacity = *psVar7;
        local_2c8.field_2._8_8_ = plVar4[3];
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2c8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_308._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
        local_308.field_2._M_allocated_capacity = *psVar7;
        local_308.field_2._8_8_ = plVar4[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar7;
      }
      local_308._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_2e8._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
        local_2e8.field_2._M_allocated_capacity = *psVar7;
        local_2e8.field_2._8_8_ = plVar4[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar7;
      }
      local_2e8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      DeathTestAbort(&local_2e8);
    }
  }
  if (iVar2 != -1) {
    do {
      iVar3 = close(local_1dc);
      if (iVar3 != -1) {
        *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar2;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1e0;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        if (local_228._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_228._M_dataplus._M_p,
                          local_228.field_2._M_allocated_capacity - (long)local_228._M_dataplus._M_p
                         );
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        return OVERSEE_TEST;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"CHECK failed: File ","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_288._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_288._M_dataplus._M_p == psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar4[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
    }
    local_288._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar7) {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
      local_2c8.field_2._8_8_ = plVar4[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_248._M_dataplus._M_p._0_4_ = 0x571;
    StreamableToString<int>(&local_268,(int *)&local_248);
    std::operator+(&local_308,&local_2c8,&local_268);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_2e8._M_dataplus._M_p = (pointer)*plVar4;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
      local_2e8.field_2._8_8_ = plVar4[3];
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar7;
    }
    local_2e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_170.sa_handler = (__sighandler_t)*plVar4;
    p_Var8 = (__sighandler_t)(plVar4 + 2);
    if (local_170.sa_handler == p_Var8) {
      local_160 = *(ulong *)p_Var8;
      uStack_158 = plVar4[3];
      local_170.sa_handler = (__sighandler_t)&local_160;
    }
    else {
      local_160 = *(ulong *)p_Var8;
    }
    local_168 = (undefined1  [8])plVar4[1];
    *plVar4 = (long)p_Var8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d8.sa_handler = (__sighandler_t)*plVar4;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.sa_handler == paVar11) {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_c8[0]._8_8_ = plVar4[3];
      local_d8.sa_handler = (__sighandler_t)local_c8;
    }
    else {
      local_c8[0]._0_8_ = paVar11->_M_allocated_capacity;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)paVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DeathTestAbort((string *)&local_d8);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_2a8._M_dataplus._M_p == psVar7) {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8.field_2._8_8_ = plVar4[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
  }
  local_2a8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  local_288._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_288._M_dataplus._M_p == psVar7) {
    local_288.field_2._M_allocated_capacity = *psVar7;
    local_288.field_2._8_8_ = plVar4[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar7;
  }
  local_288._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_200._M_dataplus._M_p._0_4_ = 0x542;
  StreamableToString<int>(&local_248,(int *)&local_200);
  std::operator+(&local_2c8,&local_288,&local_248);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_308._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_308._M_dataplus._M_p == psVar7) {
    local_308.field_2._M_allocated_capacity = *psVar7;
    local_308.field_2._8_8_ = plVar4[3];
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar7;
  }
  local_308._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_2e8._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_2e8._M_dataplus._M_p == psVar7) {
    local_2e8.field_2._M_allocated_capacity = *psVar7;
    local_2e8.field_2._8_8_ = plVar4[3];
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar7;
  }
  local_2e8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(&local_2e8);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::vector<char*> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.data(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}